

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O1

void embree::SceneGraph::storeXML
               (Ref<embree::SceneGraph::Node> *root,FileName *fileName,bool embedTextures,
               bool referenceMaterials,bool binaryFormat)

{
  Node *pNVar1;
  Ref<embree::SceneGraph::Node> local_4c8;
  XMLWriter local_4c0;
  
  pNVar1 = root->ptr;
  local_4c8.ptr = pNVar1;
  if (pNVar1 != (Node *)0x0) {
    (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
  }
  XMLWriter::XMLWriter(&local_4c0,&local_4c8,fileName,embedTextures,referenceMaterials,binaryFormat)
  ;
  std::
  _Rb_tree<std::shared_ptr<embree::Texture>,_std::pair<const_std::shared_ptr<embree::Texture>,_unsigned_long>,_std::_Select1st<std::pair<const_std::shared_ptr<embree::Texture>,_unsigned_long>_>,_std::less<std::shared_ptr<embree::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<embree::Texture>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_4c0.textureMap._M_t);
  std::
  _Rb_tree<embree::Ref<embree::SceneGraph::Node>,_std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>,_std::_Select1st<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_4c0.nodeMap._M_t);
  std::fstream::~fstream(&local_4c0.bin);
  std::fstream::~fstream(&local_4c0);
  if (pNVar1 != (Node *)0x0) {
    (*(pNVar1->super_RefCount)._vptr_RefCount[3])(pNVar1);
  }
  return;
}

Assistant:

void SceneGraph::storeXML(Ref<SceneGraph::Node> root, const FileName& fileName, bool embedTextures, bool referenceMaterials, bool binaryFormat) {
    XMLWriter(root,fileName,embedTextures,referenceMaterials,binaryFormat);
  }